

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall testing::UnitTest::total_test_count(UnitTest *this)

{
  int iVar1;
  UnitTestImpl *this_00;
  UnitTest *this_local;
  
  this_00 = impl(this);
  iVar1 = internal::UnitTestImpl::total_test_count(this_00);
  return iVar1;
}

Assistant:

int UnitTest::total_test_count() const { return impl()->total_test_count(); }